

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture2DShadowCase::iterate(Texture2DShadowCase *this)

{
  int iVar1;
  code *pcVar2;
  TestContext *pTVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  qpTestResult qVar6;
  RenderContext *pRVar7;
  int extraout_var;
  RenderTarget *pRVar8;
  char *str;
  TestLog *pTVar9;
  NotSupportedError *this_00;
  MessageBuilder *pMVar10;
  reference pvVar11;
  PixelFormat *pPVar12;
  Texture2D *pTVar13;
  size_type sVar14;
  MessageBuilder local_908;
  ConstPixelBufferAccess local_788;
  undefined1 local_75d;
  undefined1 auStack_75c [7];
  bool isOk;
  int local_754;
  MessageBuilder local_750;
  ConstPixelBufferAccess local_5d0;
  undefined1 local_5a1;
  undefined1 auStack_5a0 [7];
  bool isHighQuality;
  int local_598;
  Vector<int,_3> local_594;
  undefined1 local_588 [8];
  TexComparePrecision texComparePrecision;
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  MessageBuilder local_520;
  MessageBuilder local_3a0;
  Sampler local_21c;
  undefined1 local_1e0 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  ReferenceParams sampleParams;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ScopedLogSection local_38;
  ScopedLogSection section;
  FilterCase *curCase;
  RandomViewport viewport;
  Functions *gl;
  Texture2DShadowCase *this_local;
  
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  viewport.width = (*pRVar7->_vptr_RenderContext[3])();
  viewport.height = extraout_var;
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&curCase,pRVar8,0x40,0x40,dVar4 ^ dVar5);
  section.m_log =
       (TestLog *)
       std::
       vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
       ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Test",&local_79);
  de::toString<int>(&local_b0,&this->m_caseNdx);
  std::operator+(&local_58,&local_78,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Test ",&local_f1);
  de::toString<int>((string *)&sampleParams.baseLevel,&this->m_caseNdx);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sampleParams.baseLevel);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar9,&local_58,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&sampleParams.baseLevel);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_2D);
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1e0);
  if ((0x3f < viewport.x) && (0x3f < viewport.y)) {
    glu::mapGLSampler(&local_21c,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_21c);
    sampleParams.sampler.lodThreshold = (float)glu::mapGLCompareFunc(this->m_compareFunc);
    sampleParams.sampler.seamlessCubeMap = false;
    sampleParams.sampler._53_3_ = 0;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)&section.m_log[3].m_log;
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_3a0,(char (*) [28])"Compare reference value =  ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,sampleParams.super_RenderParams.w.m_data + 3);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3a0);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_520,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [22])"Texture coordinates: ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(Vector<float,_2> *)(section.m_log + 1));
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])" -> ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(Vector<float,_2> *)(section.m_log + 2));
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_520);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)local_1e0,(Vec2 *)(section.m_log + 1),
               (Vec2 *)(section.m_log + 2));
    pcVar2 = *(code **)(viewport._8_8_ + 0xb8);
    dVar4 = glu::Texture2D::getGLTexture((Texture2D *)(section.m_log)->m_log);
    (*pcVar2)(0xde1,dVar4);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x2800,this->m_magFilter);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x884c,0x884e);
    (**(code **)(viewport._8_8_ + 0x1360))(0xde1,0x884d,this->m_compareFunc);
    (**(code **)(viewport._8_8_ + 0x1a00))((int)curCase,curCase._4_4_,viewport.x,viewport.y);
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_1e0,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar11,(RenderParams *)((long)&rendered.m_pixels.m_cap + 4));
    pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&pixelFormat.blueBits,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    glu::readPixels(pRVar7,(int)curCase,curCase._4_4_,(PixelBufferAccess *)&pixelFormat.blueBits);
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar12 = tcu::RenderTarget::getPixelFormat(pRVar8);
    lodPrecision.derivateBits = pPVar12->redBits;
    lodPrecision.lodBits = pPVar12->greenBits;
    pixelFormat.redBits = pPVar12->blueBits;
    pixelFormat.greenBits = pPVar12->alphaBits;
    tcu::LodPrecision::LodPrecision((LodPrecision *)&texComparePrecision.referenceBits,RULE_OPENGL);
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_588);
    texComparePrecision.resultBits = 0x12;
    lodPrecision.rule = 6;
    tcu::Vector<int,_3>::Vector(&local_594,0x14,0x14,0);
    texComparePrecision.coordBits.m_data[0] = local_594.m_data[2];
    local_588._0_4_ = local_594.m_data[0];
    local_588._4_4_ = local_594.m_data[1];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_5a0,7,7,0);
    texComparePrecision.uvwBits.m_data[0] = local_598;
    texComparePrecision.coordBits.m_data[1] = auStack_5a0._0_4_;
    texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffffa64;
    texComparePrecision.uvwBits.m_data[1] = 5;
    texComparePrecision.uvwBits.m_data[2] = 0x10;
    texComparePrecision.pcfBits = lodPrecision.derivateBits + -1;
    pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_5d0,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pTVar13 = glu::Texture2D::getRefTexture((Texture2D *)(section.m_log)->m_log);
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_1e0,0);
    local_5a1 = verifyTexCompareResult<tcu::Texture2D>
                          (pTVar3,&local_5d0,pTVar13,pvVar11,
                           (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                           (TexComparePrecision *)local_588,
                           (LodPrecision *)&texComparePrecision.referenceBits,
                           (PixelFormat *)&lodPrecision.derivateBits);
    if (!(bool)local_5a1) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_750,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_750,
                           (char (*) [66])
                           "Warning: Verification assuming high-quality PCF filtering failed.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_750);
      lodPrecision.rule = 4;
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_75c,4,4,0);
      texComparePrecision.uvwBits.m_data[0] = local_754;
      texComparePrecision.coordBits.m_data[1] = auStack_75c._0_4_;
      texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffff8a8;
      texComparePrecision.uvwBits.m_data[1] = 0;
      pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_788,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pTVar13 = glu::Texture2D::getRefTexture((Texture2D *)(section.m_log)->m_log);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_1e0,0);
      local_75d = verifyTexCompareResult<tcu::Texture2D>
                            (pTVar3,&local_788,pTVar13,pvVar11,
                             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                             (TexComparePrecision *)local_588,
                             (LodPrecision *)&texComparePrecision.referenceBits,
                             (PixelFormat *)&lodPrecision.derivateBits);
      if ((bool)local_75d) {
        qVar6 = tcu::TestContext::getTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (qVar6 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_QUALITY_WARNING,"Low-quality result");
        }
      }
      else {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_908,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_908,
                             (char (*) [82])
                             "ERROR: Verification against low precision requirements failed, failing test case."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_908);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image verification failed");
      }
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar1 = this->m_caseNdx;
    sVar14 = std::
             vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
             ::size(&this->m_cases);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_1e0);
    tcu::Surface::~Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    tcu::ScopedLogSection::~ScopedLogSection(&local_38);
    return (uint)(iVar1 < (int)sVar14);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small render target","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
             ,0x150);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

Texture2DShadowCase::IterateResult Texture2DShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport		(m_context.getRenderTarget(), TEX2D_VIEWPORT_WIDTH, TEX2D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < TEX2D_MIN_VIEWPORT_WIDTH || viewport.height < TEX2D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	sampleParams.sampler			= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.compare	= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.ref				= curCase.ref;

	m_testCtx.getLog() << TestLog::Message << "Compare reference value =  " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,		m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,		m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,			m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,			m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], sampleParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}